

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderBuiltinConstantCase<int>::iterate
          (ShaderBuiltinConstantCase<int> *this)

{
  ostringstream *this_00;
  GetConstantValueFunc p_Var1;
  TestLog *pTVar2;
  int iVar3;
  undefined4 extraout_var;
  char *__s;
  TestError *this_01;
  string *unit;
  void *__buf;
  long value;
  int result;
  allocator<char> local_3a6;
  allocator<char> local_3a5;
  int local_3a4;
  string *local_3a0;
  ulong local_398;
  ScopedLogSection section;
  UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  shaderExecutor;
  string local_370;
  void *outputs;
  undefined1 local_330 [8];
  ostream local_328;
  undefined1 local_1b0 [384];
  
  p_Var1 = this->m_getValue;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_3a4 = (*p_Var1)((Functions *)CONCAT44(extraout_var,iVar3));
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_398 = 0;
  local_3a0 = &this->m_varName;
  this_00 = (ostringstream *)(local_1b0 + 8);
  while( true ) {
    if ((ShaderType)local_398 == SHADERTYPE_LAST) {
      return STOP;
    }
    __s = glu::getShaderTypeName((ShaderType)local_398);
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_330,__s,(allocator<char> *)&result);
    std::__cxx11::string::string<std::allocator<char>>((string *)&outputs,__s,&local_3a6);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_330,(string *)&outputs);
    std::__cxx11::string::~string((string *)&outputs);
    std::__cxx11::string::~string((string *)local_330);
    shaderExecutor.
    super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
    .m_data.ptr = createGetConstantExecutor
                            (((this->super_TestCase).m_context)->m_renderCtx,(ShaderType)local_398,
                             TYPE_INT,local_3a0,&this->m_requiredExt);
    result = -1;
    outputs = &result;
    iVar3 = (*(shaderExecutor.
               super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
               .m_data.ptr)->_vptr_ShaderExecutor[2])
                      (shaderExecutor.
                       super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                       .m_data.ptr);
    if ((char)iVar3 == '\0') break;
    (*(shaderExecutor.
       super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
       .m_data.ptr)->_vptr_ShaderExecutor[5])();
    (*(shaderExecutor.
       super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
       .m_data.ptr)->_vptr_ShaderExecutor[6])
              (shaderExecutor.
               super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
               .m_data.ptr,1,0,(string *)&outputs);
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    value = (long)result;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,glcts::fixed_sample_locations_values + 1,&local_3a5);
    unit = &local_370;
    tcu::LogNumber<long>::LogNumber
              ((LogNumber<long> *)local_1b0,local_3a0,local_3a0,unit,QP_KEY_TAG_NONE,value);
    tcu::LogNumber<long>::write((LogNumber<long> *)local_1b0,(int)pTVar2,__buf,(size_t)unit);
    tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)local_1b0);
    std::__cxx11::string::~string((string *)&local_370);
    if (result != local_3a4) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"ERROR: Expected ");
      std::operator<<((ostream *)this_00,(string *)local_3a0);
      std::operator<<((ostream *)this_00," = ");
      std::ostream::operator<<(this_00,local_3a4);
      local_330 = (undefined1  [8])
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
      std::operator<<(&local_328,"Test shader:");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      (*(shaderExecutor.
         super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
         .m_data.ptr)->_vptr_ShaderExecutor[3])
                (shaderExecutor.
                 super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                 .m_data.ptr,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
                );
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Invalid builtin constant value");
    }
    de::details::
    UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
    ::~UniqueBase(&shaderExecutor.
                   super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                 );
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    local_398 = (ulong)((int)local_398 + 1);
  }
  (*(shaderExecutor.
     super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
     .m_data.ptr)->_vptr_ShaderExecutor[3])
            (shaderExecutor.
             super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
             .m_data.ptr,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Compile failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
             ,0xe8);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestCase::IterateResult ShaderBuiltinConstantCase<DataType>::iterate (void)
{
	const DataType	reference	= m_getValue(m_context.getRenderContext().getFunctions());

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	for (int shaderType = 0; shaderType < glu::SHADERTYPE_LAST; shaderType++)
	{
		if ((SHADER_TYPES & (1<<shaderType)) != 0)
		{
			const char* const			shaderTypeName	= glu::getShaderTypeName(glu::ShaderType(shaderType));
			const tcu::ScopedLogSection	section			(m_testCtx.getLog(), shaderTypeName, shaderTypeName);

			try
			{
				const bool isOk = verifyInShaderType(glu::ShaderType(shaderType), reference);
				DE_ASSERT(isOk || m_testCtx.getTestResult() != QP_TEST_RESULT_PASS);
				DE_UNREF(isOk);
			}
			catch (const tcu::NotSupportedError& e)
			{
				m_testCtx.getLog() << TestLog::Message << "Not checking " << shaderTypeName << ": " << e.what() << TestLog::EndMessage;
			}
			catch (const tcu::TestError& e)
			{
				m_testCtx.getLog() << TestLog::Message << e.what() << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, e.getMessage());
			}
		}
	}

	return STOP;
}